

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_construct_destruct_valid_fn(int _i)

{
  AString *str;
  char *pcVar1;
  char *pcVar2;
  char **ppcVar3;
  int line;
  char *pcVar4;
  char *pcVar5;
  char *local_38;
  char *local_30;
  char *local_28;
  undefined8 uStack_20;
  
  uStack_20 = 0x11d2f2;
  str = AString_construct();
  if (str == (AString *)0x0) {
    ppcVar3 = &local_28;
    pcVar2 = "Assertion \'_ck_x != NULL\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %#x";
    pcVar4 = "(void*) string != NULL";
    pcVar5 = "(void*) string";
    line = 0x53;
  }
  else {
    uStack_20 = 0x11d30f;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x53);
    if (str->reallocator == (ACUtilsReallocator)0x0) {
      ppcVar3 = &local_28;
      pcVar2 = "Assertion \'_ck_x != NULL\' failed";
      pcVar1 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) string->reallocator != NULL";
      pcVar5 = "(void*) string->reallocator";
      line = 0x54;
    }
    else {
      uStack_20 = 0x11d32a;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x54);
      if (str->deallocator == (ACUtilsDeallocator)0x0) {
        ppcVar3 = &local_28;
        pcVar2 = "Assertion \'_ck_x != NULL\' failed";
        pcVar1 = "Assertion \'%s\' failed: %s == %#x";
        pcVar4 = "(void*) string->deallocator != NULL";
        pcVar5 = "(void*) string->deallocator";
        line = 0x55;
      }
      else {
        uStack_20 = 0x11d346;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x55);
        if ((char *)str->capacity != (char *)0x8) {
          uStack_20 = 0;
          local_28 = (char *)0x8;
          local_30 = "(8)";
          local_38 = (char *)str->capacity;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x56,"Assertion \'_ck_x == _ck_y\' failed",
                            "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                            "(*string).capacity == (8)","(*string).capacity");
        }
        uStack_20 = 0x11d365;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x56);
        if (str->buffer == (char *)0x0) {
          ppcVar3 = &local_28;
          pcVar2 = "Assertion \'_ck_x != NULL\' failed";
          pcVar1 = "Assertion \'%s\' failed: %s == %#x";
          pcVar4 = "(void*) (*string).buffer != NULL";
          pcVar5 = "(void*) (*string).buffer";
        }
        else {
          uStack_20 = 0x11d381;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x56);
          pcVar1 = str->buffer;
          if (pcVar1 == (char *)0x0) {
            pcVar1 = "(null)";
            pcVar2 = "";
LAB_0011d507:
            uStack_20 = 0;
            local_28 = "\"";
            local_30 = "";
            local_38 = "\"";
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x56,
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                              "(*string).buffer == (\"\")","(*string).buffer",pcVar2,pcVar1,pcVar2,
                              "(\"\")");
          }
          if (*pcVar1 != '\0') {
            pcVar2 = "\"";
            goto LAB_0011d507;
          }
          uStack_20 = 0x11d3b0;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x56);
          local_38 = (char *)str->size;
          if (local_38 == (char *)0x0) {
            uStack_20 = 0x11d3ce;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x56);
            AString_destruct(str);
            return;
          }
          ppcVar3 = &local_38;
          local_30 = "strlen(\"\")";
          pcVar2 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar4 = "(*string).size == strlen(\"\")";
          pcVar5 = "(*string).size";
        }
        line = 0x56;
      }
    }
  }
  uStack_20 = 0;
  local_28 = (char *)0x0;
  *(code **)((long)ppcVar3 + -8) = test_AString_construct_destruct_fromCString_valid_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,pcVar2,pcVar1,pcVar4,pcVar5);
}

Assistant:

START_TEST(test_AString_construct_destruct_valid)
{
    struct AString *string = AString_construct();
    ACUTILSTEST_ASSERT_PTR_NONNULL(string);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->reallocator);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->deallocator);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*string, "", 8);
    AString_destruct(string);
}